

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

RawSchema ** __thiscall
kj::Vector<capnp::_::RawSchema*>::add<capnp::_::RawSchema*&>
          (Vector<capnp::_::RawSchema*> *this,RawSchema **params)

{
  RawSchema **ppRVar1;
  undefined8 *puVar2;
  
  puVar2 = *(undefined8 **)(this + 8);
  if (puVar2 == *(undefined8 **)(this + 0x10)) {
    Vector<capnp::_::RawSchema_*>::grow((Vector<capnp::_::RawSchema_*> *)this,0);
    puVar2 = *(undefined8 **)(this + 8);
  }
  *puVar2 = *params;
  ppRVar1 = *(RawSchema ***)(this + 8);
  *(RawSchema ***)(this + 8) = ppRVar1 + 1;
  return ppRVar1;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }